

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

bool __thiscall webfront::http::Request::completeRequest(Request *this,char input)

{
  string_view text;
  bool bVar1;
  int iVar2;
  BadRequestException *this_00;
  undefined8 uVar3;
  char in_SIL;
  long in_RDI;
  anon_class_8_1_8991fb9c setState;
  anon_class_1_0_00000001 isDigit;
  anon_class_1_0_00000001 isSpecial;
  anon_class_1_0_00000001 isCtrl;
  anon_class_1_0_00000001 isChar;
  value_type *in_stack_ffffffffffffff08;
  char cVar4;
  Header *in_stack_ffffffffffffff10;
  State next;
  undefined8 in_stack_ffffffffffffff18;
  Request *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  anon_class_1_0_00000001 local_15;
  anon_class_1_0_00000001 local_14;
  anon_class_1_0_00000001 local_13;
  anon_class_1_0_00000001 local_12;
  char local_11;
  
  local_12 = (anon_class_1_0_00000001)0x0;
  local_13 = (anon_class_1_0_00000001)0x0;
  local_14 = (anon_class_1_0_00000001)0x0;
  local_15 = (anon_class_1_0_00000001)0x0;
  local_11 = in_SIL;
  if ((completeRequest(char)::buffer_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&completeRequest(char)::buffer_abi_cxx11_), iVar2 != 0)) {
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20);
    __cxa_atexit(::std::__cxx11::string::~string,&completeRequest(char)::buffer_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&completeRequest(char)::buffer_abi_cxx11_);
  }
  bVar1 = SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0);
  next = (State)in_stack_ffffffffffffff18;
  switch(*(undefined4 *)(in_RDI + 0x48)) {
  case 0:
    bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_12,local_11);
    cVar4 = (char)((ulong)in_stack_ffffffffffffff08 >> 0x38);
    if ((bVar1) &&
       (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11), !bVar1)) {
      completeRequest::anon_class_1_0_00000001::operator()(&local_14,local_11);
    }
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,
               SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),(State)in_stack_ffffffffffffff18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_stack_ffffffffffffff10->name,cVar4);
    break;
  case 1:
    if (local_11 == ' ') {
      *(undefined4 *)(in_RDI + 0x48) = 2;
      ::std::__cxx11::string::operator_cast_to_basic_string_view(&in_stack_ffffffffffffff10->name);
      text._M_str = in_stack_ffffffffffffff30;
      text._M_len = in_stack_ffffffffffffff28;
      setMethod(in_stack_ffffffffffffff20,text);
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_12,local_11);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
      if (((!bVar1) ||
          (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11), bVar1))
         || (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_14,local_11), bVar1
            )) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20,cVar4);
    }
    break;
  case 2:
    if (local_11 == ' ') {
      *(undefined4 *)(in_RDI + 0x48) = 3;
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11);
      if (bVar1) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20,(char)((ulong)in_stack_ffffffffffffff18 >> 0x38));
    }
    break;
  case 3:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 4:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 5:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 6:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 7:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    *(undefined4 *)(in_RDI + 0x40) = 0;
    *(undefined4 *)(in_RDI + 0x44) = 0;
    break;
  case 8:
    completeRequest::anon_class_1_0_00000001::operator()(&local_15,local_11);
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,
               SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),(State)in_stack_ffffffffffffff18);
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) * 10 + (int)local_11 + -0x30;
    break;
  case 9:
    if (local_11 == '.') {
      *(undefined4 *)(in_RDI + 0x48) = 10;
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_15,local_11);
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) * 10 + (int)local_11 + -0x30;
    }
    break;
  case 10:
    completeRequest::anon_class_1_0_00000001::operator()(&local_15,local_11);
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,
               SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),(State)in_stack_ffffffffffffff18);
    *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) * 10 + (int)local_11 + -0x30;
    break;
  case 0xb:
    if (local_11 == '\r') {
      *(undefined4 *)(in_RDI + 0x48) = 0xc;
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_15,local_11);
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) * 10 + (int)local_11 + -0x30;
    }
    break;
  case 0xc:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 0xd:
    if (local_11 == '\r') {
      *(undefined4 *)(in_RDI + 0x48) = 0x13;
    }
    else {
      bVar1 = std::
              vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              ::empty((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                       *)in_stack_ffffffffffffff20);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
      if ((bVar1) || ((local_11 != ' ' && (local_11 != '\t')))) {
        bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_12,local_11);
        if ((!bVar1) ||
           ((bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11), bVar1
            || (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_14,local_11),
               bVar1)))) {
          uVar3 = __cxa_allocate_exception(0x10);
          BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10)
          ;
          __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException
                     );
        }
        Headers::Header::Header(in_stack_ffffffffffffff10);
        std::
        vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
        push_back((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                   *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        Headers::Header::~Header(in_stack_ffffffffffffff10);
        std::
        vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
        back((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)in_stack_ffffffffffffff10);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff20,cVar4);
        *(undefined4 *)(in_RDI + 0x48) = 0xf;
      }
      else {
        *(undefined4 *)(in_RDI + 0x48) = 0xe;
      }
    }
    break;
  case 0xe:
    if (local_11 == '\r') {
      *(undefined4 *)(in_RDI + 0x48) = 0x12;
    }
    else if ((local_11 != ' ') && (local_11 != '\t')) {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
      if (bVar1) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      *(undefined4 *)(in_RDI + 0x48) = 0x11;
      std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
      ::back((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)in_stack_ffffffffffffff10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20,cVar4);
    }
    break;
  case 0xf:
    if (local_11 == ':') {
      *(undefined4 *)(in_RDI + 0x48) = 0x10;
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_12,local_11);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
      if (((!bVar1) ||
          (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11), bVar1))
         || (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_14,local_11), bVar1
            )) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
      ::back((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)in_stack_ffffffffffffff10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20,cVar4);
    }
    break;
  case 0x10:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 0x11:
    if (local_11 == '\r') {
      *(undefined4 *)(in_RDI + 0x48) = 0x12;
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_13,local_11);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
      if (bVar1) {
        uVar3 = __cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
      }
      std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
      ::back((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)in_stack_ffffffffffffff10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20,cVar4);
    }
    break;
  case 0x12:
    completeRequest::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff20,bVar1,next);
    break;
  case 0x13:
    if (local_11 == '\n') {
      *(undefined4 *)(in_RDI + 0x48) = 0x14;
      return true;
    }
    this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException(this_00);
    __cxa_throw(this_00,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
  case 0x14:
    return true;
  default:
    uVar3 = __cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException((BadRequestException *)in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&BadRequestException::typeinfo,BadRequestException::~BadRequestException);
  }
  return false;
}

Assistant:

bool completeRequest(char input) {
        auto isChar = [](char c) { return c >= 0; };
        auto isCtrl = [](char c) { return (c >= 0 && c <= 31) || (c == 127); };
        auto isSpecial = [](char c) {   switch (c) {
            case '(': case ')': case '<': case '>': case '@': case ',': case ';': case ':': case '\\': case '"':
            case '/': case '[': case ']': case '?': case '=': case '{': case '}': case ' ': case '\t': return true;
            default: return false;
        }};
        auto isDigit = [](char c) { return c >= '0' && c <= '9'; };
        auto setState = [this](bool cond, State next) {
            state = next;
            if (cond) throw BadRequestException();
        };

        static std::string buffer;
        using enum State;
        switch (state) {
            case methodStart:
                setState(!isChar(input) || isCtrl(input) || isSpecial(input), method);
                buffer = input;
                break;
            case method: if (input == ' ') { state = URI; setMethod(buffer); }
                              else if (!isChar(input) || isCtrl(input) || isSpecial(input)) { throw BadRequestException(); }
                              else buffer.push_back(input);
                break;
            case URI: if (input == ' ') { state = versionH; break; }
                           else if (isCtrl(input)) throw BadRequestException();
                           else { uri.push_back(input); break; }
            case versionH: setState(input != 'H', versionT1); break;
            case versionT1: setState(input != 'T', versionT2); break;
            case versionT2: setState(input != 'T', versionP); break;
            case versionP: setState(input != 'P', versionSlash); break;
            case versionSlash: setState(input != '/', versionMajorStart); httpVersionMajor = 0; httpVersionMinor = 0; break;
            case versionMajorStart: setState(!isDigit(input), versionMajor); httpVersionMajor = httpVersionMajor * 10 + input - '0'; break;
            case versionMajor: if (input == '.') state = versionMinorStart;
                                    else if (isDigit(input)) httpVersionMajor = httpVersionMajor * 10 + input - '0';
                                    else throw BadRequestException();
                break;
            case versionMinorStart: setState(!isDigit(input), versionMinor); httpVersionMinor = httpVersionMinor * 10 + input - '0'; break;
            case versionMinor: if (input == '\r') state = newline1;
                                    else if (isDigit(input)) httpVersionMinor = httpVersionMinor * 10 + input - '0';
                                    else throw BadRequestException();
                break;
            case newline1: setState(input != '\n', headerLineStart); break;
            case headerLineStart: if (input == '\r') { state = newline3; break; }
                                       else if (!headers.empty() && (input == ' ' || input == '\t')) { state = headerLws; break; }
                                       else if (!isChar(input) || isCtrl(input) || isSpecial(input)) throw BadRequestException();
                                       else { headers.push_back({}); headers.back().name.push_back(input); state = headerName; break; }
            case headerLws:if (input == '\r') { state = newline2; break; }
                                 else if (input == ' ' || input == '\t') break;
                                 else if (isCtrl(input)) throw BadRequestException();
                                 else { state = headerValue; headers.back().value.push_back(input); break; }
            case headerName: if (input == ':') { state = spaceBeforeHeaderValue; break; }
                                  else if (!isChar(input) || isCtrl(input) || isSpecial(input)) throw BadRequestException();
                                  else { headers.back().name.push_back(input); break; }
            case spaceBeforeHeaderValue: setState(input != ' ', headerValue); break;
            case headerValue: if (input == '\r') { state = newline2; break; }
                                   else if (isCtrl(input)) throw BadRequestException();
                                   else { headers.back().value.push_back(input); break; }
            case newline2: setState(input != '\n', headerLineStart); break;
            case newline3: if (input == '\n') { state = completed; return true; } else throw BadRequestException();
            case completed: return true;
            default: throw BadRequestException();
        }
        return false;
    }